

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Float32_To_UInt8_Clip
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *src;
  float fVar1;
  float fVar2;
  
  if (count != 0) {
    do {
      fVar2 = -128.0;
      if (-128.0 <= *sourceBuffer * 127.0) {
        fVar2 = *sourceBuffer * 127.0;
      }
      fVar1 = 127.0;
      if (fVar2 <= 127.0) {
        fVar1 = fVar2;
      }
      *(char *)destinationBuffer = (char)(int)fVar1 + -0x80;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride * 4);
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Float32_To_UInt8_Clip(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    float *src = (float*)sourceBuffer;
    unsigned char *dest =  (unsigned char*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        PaInt32 samp = 128 + (PaInt32)(*src * (127.0f));
        PA_CLIP_( samp, 0x0000, 0x00FF );
        *dest = (unsigned char) samp;

        src += sourceStride;
        dest += destinationStride;
    }
}